

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_composition_test.cpp
# Opt level: O0

void __thiscall
CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method
          (CatcherComposition_with_custom_action_works *this)

{
  bool in_R9B;
  undefined1 local_c1;
  undefined1 *local_c0;
  undefined1 local_b8 [24];
  undefined1 *local_a0;
  undefined1 local_98 [48];
  undefined1 *local_68;
  undefined1 local_60 [8];
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:74:48)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:73:48)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:72:48)>
  catcher;
  int hit;
  CatcherComposition_with_custom_action_works *this_local;
  
  catcher._68_4_ = 0;
  local_c0 = &catcher.field_0x44;
  local_a0 = local_c0;
  local_68 = local_c0;
  mittens::
  bad_alloc_handler<mittens::UnHandler<int>,CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method()::__0>
            ((GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:74:48)>
              *)local_b8,(mittens *)0xfffffffd,(FailCodeType)local_c0,
             (anon_class_8_1_ba1d4ef3_for_customAction_)&local_c1,(UnHandler<int> *)0x1,in_R9B);
  mittens::
  std_exception_handler<mittens::GenericExceptionHandler<std::bad_alloc,mittens::UnHandler<int>,CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method()::__0>,CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method()::__1>
            ((GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:74:48)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:73:48)>
              *)local_98,(mittens *)0xfffffffe,(FailCodeType)local_a0,
             (anon_class_8_1_ba1d4ef3_for_customAction_)local_b8,
             (GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:74:48)>
              *)0x1,in_R9B);
  mittens::
  all_catcher<mittens::GenericExceptionHandler<std::exception,mittens::GenericExceptionHandler<std::bad_alloc,mittens::UnHandler<int>,CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method()::__0>,CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method()::__1>,CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method()::__2>
            ((GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:74:48)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:73:48)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:72:48)>
              *)local_60,(mittens *)0xffffffff,(FailCodeType)local_68,
             (anon_class_8_1_ba1d4ef3_for_customAction_)local_98,
             (GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:74:48)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_handler_composition_test_cpp:73:48)>
              *)0x1,in_R9B);
  throw_bad_alloc();
  throw_std_exception();
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CatcherComposition_with_custom_action_works)
{
   int hit=0;
   auto catcher = all_catcher(             -1, [&hit](){ ++hit; }, 
                     std_exception_handler(-2, [&hit](std::exception&){ ++hit; }, 
                        bad_alloc_handler( -3, [&hit](std::bad_alloc&){ ++hit; }, 
                           UnHandler<>()))); 

   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(0,hit);
      BOOST_CHECK_EQUAL(-3, catcher.handleException());
      BOOST_CHECK_EQUAL(1,hit);
   }

   try
   {
      throw_std_exception();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(1,hit);
      BOOST_CHECK_EQUAL(-2, catcher.handleException());
      BOOST_CHECK_EQUAL(2,hit);
   }

   try
   {
      throw_int();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(2,hit);
      BOOST_CHECK_EQUAL(-1, catcher.handleException());
      BOOST_CHECK_EQUAL(3,hit);
   }
}